

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall soul::heart::Printer::PrinterStream::printConnections(PrinterStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Connection *pCVar2;
  char *__s;
  size_t sVar3;
  CodePrinter *pCVar4;
  pointer ppVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  char s [2];
  char local_62 [2];
  string local_60;
  PrinterStream *local_40;
  pointer local_38;
  
  ppVar5 = (this->module->connections).
           super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->module->connections).
             super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != local_38) {
    local_40 = this;
    do {
      pCVar2 = ppVar5->object;
      pCVar4 = this->out;
      text._M_str = "connection ";
      text._M_len = 0xb;
      choc::text::CodePrinter::writeBlock(pCVar4,text);
      __s = getInterpolationDescription(pCVar2->interpolationType);
      sVar3 = strlen(__s);
      text_00._M_str = __s;
      text_00._M_len = sVar3;
      choc::text::CodePrinter::writeBlock(pCVar4,text_00);
      local_62[0] = ' ';
      local_62[1] = '\0';
      paVar1 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      sVar3 = strlen(local_62);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_62,local_62 + sVar3)
      ;
      choc::text::CodePrinter::append(pCVar4,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                 local_60.field_2._M_allocated_capacity._0_2_) + 1);
      }
      this = local_40;
      printEndpointReference(local_40,&pCVar2->source);
      if ((pCVar2->delayLength).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == true) {
        pCVar4 = this->out;
        text_01._M_str = " -> [";
        text_01._M_len = 5;
        choc::text::CodePrinter::writeBlock(pCVar4,text_01);
        pCVar4 = choc::text::CodePrinter::operator<<
                           (pCVar4,(pCVar2->delayLength).super__Optional_base<long,_true,_true>.
                                   _M_payload.super__Optional_payload_base<long>._M_payload._M_value
                           );
        local_62[0] = ']';
        local_62[1] = '\0';
        local_60._M_dataplus._M_p = (pointer)paVar1;
        sVar3 = strlen(local_62);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,local_62,local_62 + sVar3);
        choc::text::CodePrinter::append(pCVar4,&local_60);
        this = local_40;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                   local_60.field_2._M_allocated_capacity._0_2_) + 1);
          this = local_40;
        }
      }
      text_02._M_str = " -> ";
      text_02._M_len = 4;
      choc::text::CodePrinter::writeBlock(this->out,text_02);
      printEndpointReference(this,&pCVar2->dest);
      pCVar4 = this->out;
      local_62[0] = ';';
      local_62[1] = '\0';
      local_60._M_dataplus._M_p = (pointer)paVar1;
      sVar3 = strlen(local_62);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_62,local_62 + sVar3)
      ;
      choc::text::CodePrinter::append(pCVar4,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                 local_60.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_60.field_2._M_allocated_capacity._0_2_ = 10;
      local_60._M_string_length = 1;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      choc::text::CodePrinter::append(pCVar4,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                 local_60.field_2._M_allocated_capacity._0_2_) + 1);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != local_38);
  }
  return;
}

Assistant:

void printConnections()
        {
            for (auto c : module.connections)
            {
                out << "connection "
                    << getInterpolationDescription (c->interpolationType)
                    << ' ';

                printEndpointReference (c->source);

                if (c->delayLength)
                    out << " -> [" << *c->delayLength << ']';

                out << " -> ";
                printEndpointReference (c->dest);
                out << ';' << newLine;
            }
        }